

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O2

int AF_A_Burnination(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  VM_UBYTE VVar2;
  DObject *this;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  sector_t *psVar11;
  APhosphorousFire *pAVar12;
  AActor *ent;
  char *__assertion;
  FSoundID local_4c;
  undefined1 local_48 [20];
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  double local_28;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0055059c;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_0055058c;
  ent = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (ent == (AActor *)0x0) goto LAB_00550323;
    bVar6 = DObject::IsKindOf((DObject *)ent,AActor::RegistrationInfo.MyClass);
    if (!bVar6) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0055059c;
    }
  }
  else {
    if (ent != (AActor *)0x0) goto LAB_0055058c;
LAB_00550323:
    ent = (AActor *)0x0;
  }
  if (numparam == 1) goto LAB_005503a3;
  VVar2 = param[1].field_0.field_3.Type;
  if (VVar2 != 0xff) {
    if (VVar2 != '\x03') {
LAB_0055058c:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_0055059c;
    }
    this = (DObject *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if ((this != (DObject *)0x0) &&
         (bVar6 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar6)) {
        __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_0055059c;
      }
    }
    else if (this != (DObject *)0x0) goto LAB_0055058c;
  }
  if ((((uint)numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
     ((VVar2 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005503a3:
    (ent->Vel).Z = (ent->Vel).Z + -8.0;
    iVar7 = FRandom::Random2(&pr_phburn,3);
    (ent->Vel).X = (double)iVar7 + (ent->Vel).X;
    iVar7 = FRandom::Random2(&pr_phburn,3);
    (ent->Vel).Y = (double)iVar7 + (ent->Vel).Y;
    local_4c.ID = S_FindSound("world/largefire");
    S_Sound(ent,2,&local_4c,1.0,1.0);
    if (((ent->flags).Value & 0x20000) == 0) {
      uVar8 = FRandom::operator()(&pr_phburn);
      uVar9 = FRandom::operator()(&pr_phburn);
      uVar10 = -(uVar8 & 0x1f);
      if (-1 < (char)uVar8) {
        uVar10 = uVar8 & 0x1f;
      }
      uVar8 = -(uVar9 & 0x1f);
      if (-1 < (char)uVar9) {
        uVar8 = uVar9 & 0x1f;
      }
      AActor::Vec2Offset((AActor *)local_48,(double)(int)uVar10,(double)(int)uVar8,SUB81(ent,0));
      psVar11 = P_PointInSector((DVector2 *)local_48);
      dVar4 = secplane_t::ZatPoint(&psVar11->floorplane,(DVector2 *)local_48);
      local_28 = (ent->__Pos).Z;
      if (ent->MaxStepHeight + local_28 < dVar4) {
        local_48._0_4_ = *(undefined4 *)&(ent->__Pos).X;
        local_48._4_4_ = *(undefined4 *)((long)&(ent->__Pos).X + 4);
        local_48._8_4_ = *(undefined4 *)&(ent->__Pos).Y;
        local_48._12_4_ = *(undefined4 *)((long)&(ent->__Pos).Y + 4);
      }
      local_28 = local_28 + 4.0;
      local_48._16_4_ = local_48._0_4_;
      uStack_34 = local_48._4_4_;
      uStack_30 = local_48._8_4_;
      uStack_2c = local_48._12_4_;
      pAVar12 = Spawn<APhosphorousFire>((DVector3 *)(local_48 + 0x10),ALLOW_REPLACE);
      if (pAVar12 != (APhosphorousFire *)0x0) {
        dVar4 = (ent->Vel).X;
        iVar7 = FRandom::Random2(&pr_phburn,7);
        (pAVar12->super_AActor).Vel.X = (double)iVar7 + dVar4;
        dVar4 = (ent->Vel).Y;
        iVar7 = FRandom::Random2(&pr_phburn,7);
        dVar4 = (double)iVar7 + dVar4;
        dVar5 = (ent->Vel).Z + -1.0;
        auVar3._8_4_ = SUB84(dVar5,0);
        auVar3._0_8_ = dVar4;
        auVar3._12_4_ = (int)((ulong)dVar5 >> 0x20);
        (pAVar12->super_AActor).Vel.Y = dVar4;
        (pAVar12->super_AActor).Vel.Z = (double)auVar3._8_8_;
        uVar10 = FRandom::operator()(&pr_phburn);
        (pAVar12->super_AActor).reactiontime = (uVar10 & 3) + 2;
        pbVar1 = (byte *)((long)&(pAVar12->super_AActor).flags.Value + 2);
        *pbVar1 = *pbVar1 | 2;
      }
    }
    return 0;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_0055059c:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                ,0x277,"int AF_A_Burnination(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Burnination)
{
	PARAM_ACTION_PROLOGUE;

	self->Vel.Z -= 8;
	self->Vel.X += (pr_phburn.Random2 (3));
	self->Vel.Y += (pr_phburn.Random2 (3));
	S_Sound (self, CHAN_VOICE, "world/largefire", 1, ATTN_NORM);

	// Only the main fire spawns more.
	if (!(self->flags & MF_DROPPED))
	{
		// Original x and y offsets seemed to be like this:
		//		x + (((pr_phburn() + 12) & 31) << F.RACBITS);
		//
		// But that creates a lop-sided burn because it won't use negative offsets.
		int xofs, xrand = pr_phburn();
		int yofs, yrand = pr_phburn();

		// Adding 12 is pointless if you're going to mask it afterward.
		xofs = xrand & 31;
		if (xrand & 128)
		{
			xofs = -xofs;
		}

		yofs = yrand & 31;
		if (yrand & 128)
		{
			yofs = -yofs;
		}

		DVector2 pos = self->Vec2Offset((double)xofs, (double)yofs);
		sector_t * sector = P_PointInSector(pos);

		// The sector's floor is too high so spawn the flame elsewhere.
		if (sector->floorplane.ZatPoint(pos) > self->Z() + self->MaxStepHeight)
		{
			pos = self->Pos();
		}

		AActor *drop = Spawn<APhosphorousFire> (DVector3(pos, self->Z() + 4.), ALLOW_REPLACE);
		if (drop != NULL)
		{
			drop->Vel.X = self->Vel.X + pr_phburn.Random2 (7);
			drop->Vel.Y = self->Vel.Y + pr_phburn.Random2 (7);
			drop->Vel.Z = self->Vel.Z - 1;
			drop->reactiontime = (pr_phburn() & 3) + 2;
			drop->flags |= MF_DROPPED;
		}
	}
	return 0;
}